

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O2

void media_player2_player_skeleton_dbus_interface_flush(GDBusInterfaceSkeleton *_skeleton)

{
  long lVar1;
  GType GVar2;
  gpointer user_data;
  
  GVar2 = media_player2_player_skeleton_get_type();
  user_data = (gpointer)g_type_check_instance_cast(_skeleton,GVar2);
  g_mutex_lock(*(long *)((long)user_data + 0x20) + 0x20);
  lVar1 = *(long *)(*(long *)((long)user_data + 0x20) + 0x10);
  if (lVar1 != 0) {
    g_source_destroy(lVar1);
    lVar1 = *(long *)((long)user_data + 0x20);
    *(undefined8 *)(lVar1 + 0x10) = 0;
    g_mutex_unlock(lVar1 + 0x20);
    _media_player2_player_emit_changed(user_data);
    return;
  }
  g_mutex_unlock(*(long *)((long)user_data + 0x20) + 0x20);
  return;
}

Assistant:

static void
media_player2_player_skeleton_dbus_interface_flush (GDBusInterfaceSkeleton *_skeleton)
{
  MediaPlayer2PlayerSkeleton *skeleton = MEDIA_PLAYER2_PLAYER_SKELETON (_skeleton);
  gboolean emit_changed = FALSE;

  g_mutex_lock (&skeleton->priv->lock);
  if (skeleton->priv->changed_properties_idle_source != NULL)
    {
      g_source_destroy (skeleton->priv->changed_properties_idle_source);
      skeleton->priv->changed_properties_idle_source = NULL;
      emit_changed = TRUE;
    }
  g_mutex_unlock (&skeleton->priv->lock);

  if (emit_changed)
    _media_player2_player_emit_changed (skeleton);
}